

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManEquivCountLits(Gia_Man_t *p)

{
  int iVar1;
  Gia_Rpr_t *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  pGVar2 = p->pReprs;
  iVar4 = 0;
  if ((pGVar2 != (Gia_Rpr_t *)0x0) && (iVar4 = 0, p->pNexts != (int *)0x0)) {
    iVar4 = p->nObjs;
    iVar5 = 0;
    iVar6 = 0;
    for (lVar7 = 1; lVar7 < iVar4; lVar7 = lVar7 + 1) {
      iVar3 = Gia_ObjIsHead(p,(int)lVar7);
      if (iVar3 == 0) {
        if (((uint)pGVar2[lVar7] & 0xfffffff) != 0) {
          iVar3 = Gia_ObjIsNone(p,(int)lVar7);
          iVar6 = iVar6 + iVar3;
        }
      }
      else {
        iVar5 = iVar5 + 1;
      }
    }
    iVar3 = p->vCos->nSize;
    iVar1 = p->vCis->nSize;
    iVar4 = Gia_ManAndNum(p);
    iVar4 = iVar4 + (iVar3 - (iVar6 + iVar5)) + iVar1;
  }
  return iVar4;
}

Assistant:

int Gia_ManEquivCountLits( Gia_Man_t * p )
{
    int i, Counter = 0, Counter0 = 0, CounterX = 0;
    if ( p->pReprs == NULL || p->pNexts == NULL )
        return 0;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
    {
        if ( Gia_ObjIsHead(p, i) )
            Counter++;
        else if ( Gia_ObjIsConst(p, i) )
            Counter0++;
        else if ( Gia_ObjIsNone(p, i) )
            CounterX++;
    }
    CounterX -= Gia_ManCoNum(p);
    return Gia_ManCiNum(p) + Gia_ManAndNum(p) - Counter - CounterX;
}